

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O0

vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
* __thiscall
nonsugar::detail::lines<std::__cxx11::wstring>
          (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           *__return_storage_ptr__,detail *this,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *s)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  wistream *pwVar3;
  wstring local_1c0 [8];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> line;
  wstringstream local_1a0 [8];
  sstream<std::__cxx11::basic_string<wchar_t>_> ss;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *s_local;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *ret;
  
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::wstringstream::wstringstream(local_1a0,(wstring *)this,_Var2);
  std::__cxx11::wstring::wstring(local_1c0);
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::vector(__return_storage_ptr__);
  while( true ) {
    pwVar3 = std::getline<wchar_t,std::char_traits<wchar_t>,std::allocator<wchar_t>>
                       ((wistream *)local_1a0,local_1c0);
    bVar1 = std::wios::operator_cast_to_bool((wios *)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18)));
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_1c0);
  }
  std::__cxx11::wstring::~wstring(local_1c0);
  std::__cxx11::wstringstream::~wstringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<String> lines(String const &s)
{
    sstream<String> ss(s);
    String line;
    std::vector<String> ret;
    while (std::getline(ss, line)) ret.push_back(std::move(line));
    return ret;
}